

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_finite.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  long lVar2;
  ostream *poVar3;
  size_t sVar4;
  invalid_argument *this;
  double dVar5;
  finite solver;
  options opt;
  tuple<double,_double,_double> local_90;
  finite local_78;
  options local_60;
  double local_38;
  double local_30;
  double local_28;
  
  options::options(&local_60,argc,argv);
  if (local_60.valid == false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage: ",7);
    pcVar1 = *argv;
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x115170);
    }
    else {
      sVar4 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar1,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," L T\n",5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"       ",7);
    pcVar1 = *argv;
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x115170);
    }
    else {
      sVar4 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar1,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," L Tmin Tmax dT\n",0x10);
    return 0x7f;
  }
  if (local_60.Tmax < local_60.Tmin) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Tmax should be larger than Tmin");
  }
  else {
    if (0.0 < local_60.dT) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"# L = ",6);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      dVar5 = (double)std::ostream::flush();
      afh::free_energy::chain::finite::finite(&local_78,dVar5);
      lVar2 = std::cout;
      *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) & 0xfffffefb | 0x100;
      *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(lVar2 + -0x18)) = 0xb;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"# ground state energy/L: ",0x19);
      poVar3 = std::ostream::_M_insert<double>
                         (*local_78.eigenvalues_.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                           m_data / (((double)CONCAT44(0x45300000,(int)(local_78.L_ >> 0x20)) -
                                     1.9342813113834067e+25) +
                                    ((double)CONCAT44(0x43300000,(int)local_78.L_) -
                                    4503599627370496.0)));
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"# first excitation gap: ",0x18);
      poVar3 = std::ostream::_M_insert<double>
                         (local_78.eigenvalues_.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                          m_data[1] -
                          *local_78.eigenvalues_.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                           m_data);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"# [T] [free energy/L] [energy/L] [entropy/L]\n",0x2d);
      if (local_60.Tmin < local_60.dT * 0.0001 + local_60.Tmax) {
        dVar5 = local_60.Tmin;
        do {
          afh::free_energy::chain::finite::free_energy(&local_90,&local_78,dVar5);
          local_28 = local_90.super__Tuple_impl<0UL,_double,_double,_double>.
                     super__Head_base<0UL,_double,_false>._M_head_impl;
          local_38 = (double)CONCAT71(local_90.super__Tuple_impl<0UL,_double,_double,_double>.
                                      super__Tuple_impl<1UL,_double,_double>.
                                      super__Tuple_impl<2UL,_double>.
                                      super__Head_base<2UL,_double,_false>._M_head_impl._1_7_,
                                      local_90.super__Tuple_impl<0UL,_double,_double,_double>.
                                      super__Tuple_impl<1UL,_double,_double>.
                                      super__Tuple_impl<2UL,_double>.
                                      super__Head_base<2UL,_double,_false>._M_head_impl._0_1_);
          local_30 = local_90.super__Tuple_impl<0UL,_double,_double,_double>.
                     super__Tuple_impl<1UL,_double,_double>.super__Head_base<1UL,_double,_false>.
                     _M_head_impl;
          poVar3 = std::ostream::_M_insert<double>(dVar5);
          local_90.super__Tuple_impl<0UL,_double,_double,_double>.
          super__Tuple_impl<1UL,_double,_double>.super__Tuple_impl<2UL,_double>.
          super__Head_base<2UL,_double,_false>._M_head_impl._0_1_ = 0x20;
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_90,1);
          poVar3 = std::ostream::_M_insert<double>(local_28);
          local_90.super__Tuple_impl<0UL,_double,_double,_double>.
          super__Tuple_impl<1UL,_double,_double>.super__Tuple_impl<2UL,_double>.
          super__Head_base<2UL,_double,_false>._M_head_impl._0_1_ = 0x20;
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_90,1);
          poVar3 = std::ostream::_M_insert<double>(local_30);
          local_90.super__Tuple_impl<0UL,_double,_double,_double>.
          super__Tuple_impl<1UL,_double,_double>.super__Tuple_impl<2UL,_double>.
          super__Head_base<2UL,_double,_false>._M_head_impl._0_1_ = 0x20;
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_90,1);
          poVar3 = std::ostream::_M_insert<double>(local_38);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          dVar5 = dVar5 + local_60.dT;
        } while (dVar5 < local_60.dT * 0.0001 + local_60.Tmax);
      }
      free(local_78.eigenvalues_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      return 0;
    }
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"dT should be positive");
  }
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

int main(int argc, char** argv) {
  options opt(argc, argv);
  if (!opt.valid) {
    std::cerr << "Usage: " << argv[0] << " L T\n"
              << "       " << argv[0] << " L Tmin Tmax dT\n";
    return 127;
  }
  if (opt.Tmin > opt.Tmax) throw(std::invalid_argument("Tmax should be larger than Tmin"));
  if (opt.dT <= 0) throw(std::invalid_argument("dT should be positive"));
  std::cout << "# L = " << opt.L << std::endl;

  afh::free_energy::chain::finite solver(opt.L);
  std::cout << std::scientific << std::setprecision(11);
  std::cout << "# ground state energy/L: " << solver.gs_energy() << std::endl;
  std::cout << "# first excitation gap: " << solver.gap() << std::endl;

  std::cout << "# [T] [free energy/L] [energy/L] [entropy/L]\n";
  for (auto t = opt.Tmin; t < opt.Tmax + 1e-4 * opt.dT; t += opt.dT) {
    double f, e, s;
    std::tie(f, e, s) = solver.free_energy(t);
    std::cout << t << ' ' << f << ' ' << e << ' ' << s << std::endl;
  }
}